

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Packing_x86_fma::forward_int8
          (Packing_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  uint uVar2;
  uint _h;
  uint uVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int _c;
  long lVar19;
  long lVar20;
  uint _elempack;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  long local_88;
  long local_78;
  long local_70;
  long local_68;
  
  if ((this->super_Packing).use_padding != 0) {
LAB_0040ef24:
    iVar11 = Packing::forward(&this->super_Packing,bottom_blob,top_blob,opt);
    return iVar11;
  }
  uVar2 = bottom_blob->elempack;
  uVar16 = (ulong)uVar2;
  _elempack = (this->super_Packing).out_elempack;
  if (uVar2 != _elempack) {
    bVar7 = _elempack != 8;
    bVar8 = uVar2 != 1;
    bVar9 = _elempack == 1;
    bVar10 = uVar2 == 8;
    if ((bVar7 || bVar8) && (!bVar9 || !bVar10)) goto LAB_0040ef24;
    uVar15 = bottom_blob->elemsize;
    iVar11 = bottom_blob->dims;
    iVar24 = bottom_blob->w;
    _h = bottom_blob->h;
    uVar12 = (ulong)_h;
    if (iVar11 == 2) {
      uVar25 = (long)(int)(_h * uVar2) / (long)(int)_elempack;
      if ((int)(_h * uVar2) % (int)_elempack == 0) {
        iVar11 = (int)uVar25;
        Mat::create(top_blob,iVar24,iVar11,(ulong)_elempack * (uVar15 / uVar16),_elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep != 0) {
          if (!bVar7 && !bVar8) {
            uVar16 = 0;
            iVar23 = 0;
            if (0 < iVar24) {
              iVar23 = iVar24;
            }
            uVar15 = uVar25 & 0xffffffff;
            if (iVar11 < 1) {
              uVar15 = uVar16;
            }
            lVar14 = 1;
            lVar17 = 2;
            lVar18 = 3;
            local_88 = 4;
            local_68 = 5;
            local_70 = 6;
            local_78 = 7;
            for (uVar25 = 0; uVar25 != uVar15; uVar25 = uVar25 + 1) {
              lVar21 = (long)bottom_blob->w;
              pvVar5 = bottom_blob->data;
              sVar13 = bottom_blob->elemsize;
              lVar20 = top_blob->elemsize * uVar25 * (long)top_blob->w;
              pvVar6 = top_blob->data;
              for (lVar22 = 0; iVar23 != (int)lVar22; lVar22 = lVar22 + 1) {
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * uVar16 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 1) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * lVar14 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 2) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * lVar17 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 3) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * lVar18 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 4) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * local_88 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 5) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * local_68 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 6) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * local_70 * lVar21);
                *(undefined1 *)((long)pvVar6 + lVar22 * 8 + lVar20 + 7) =
                     *(undefined1 *)((long)pvVar5 + lVar22 + sVar13 * local_78 * lVar21);
              }
              uVar16 = uVar16 + 8;
              lVar14 = lVar14 + 8;
              lVar17 = lVar17 + 8;
              lVar18 = lVar18 + 8;
              local_88 = local_88 + 8;
              local_68 = local_68 + 8;
              local_70 = local_70 + 8;
              local_78 = local_78 + 8;
            }
          }
          if (bVar9 && bVar10) {
            lVar14 = 1;
            lVar17 = 2;
            lVar18 = 3;
            local_88 = 4;
            local_68 = 5;
            local_70 = 6;
            local_78 = 7;
            if (iVar24 < 1) {
              iVar24 = 0;
            }
            if ((int)_h < 1) {
              uVar12 = 0;
            }
            lVar20 = 0;
            for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
              lVar22 = (long)top_blob->w;
              sVar13 = top_blob->elemsize;
              lVar21 = bottom_blob->elemsize * uVar16 * (long)bottom_blob->w;
              pvVar5 = top_blob->data;
              pvVar6 = bottom_blob->data;
              for (lVar19 = 0; iVar24 != (int)lVar19; lVar19 = lVar19 + 1) {
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * lVar20 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * lVar14 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 1);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * lVar17 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 2);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * lVar18 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 3);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * local_88 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 4);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * local_68 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 5);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * local_70 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 6);
                *(undefined1 *)((long)pvVar5 + lVar19 + sVar13 * local_78 * lVar22) =
                     *(undefined1 *)((long)pvVar6 + lVar19 * 8 + lVar21 + 7);
              }
              lVar20 = lVar20 + 8;
              lVar14 = lVar14 + 8;
              lVar17 = lVar17 + 8;
              lVar18 = lVar18 + 8;
              local_88 = local_88 + 8;
              local_68 = local_68 + 8;
              local_70 = local_70 + 8;
              local_78 = local_78 + 8;
            }
          }
          return 0;
        }
        return -100;
      }
    }
    else if (iVar11 == 1) {
      if ((int)(iVar24 * uVar2) % (int)_elempack == 0) {
        if (top_blob != bottom_blob) {
          piVar4 = bottom_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = top_blob->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->c = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          piVar4 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar4;
          top_blob->allocator = bottom_blob->allocator;
          top_blob->dims = bottom_blob->dims;
          iVar11 = bottom_blob->d;
          top_blob->h = bottom_blob->h;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          _elempack = (this->super_Packing).out_elempack;
        }
        iVar11 = (int)(iVar24 * uVar2) / (int)_elempack;
        top_blob->w = iVar11;
        top_blob->cstep = (long)iVar11;
        top_blob->elemsize = (uVar15 / uVar16) * (long)(int)_elempack;
        top_blob->elempack = _elempack;
        return 0;
      }
    }
    else {
      if (1 < iVar11 - 3U) {
        return 0;
      }
      uVar3 = bottom_blob->c;
      if ((int)(uVar2 * uVar3) % (int)_elempack == 0) {
        iVar23 = bottom_blob->d;
        uVar12 = (long)(int)(uVar3 * uVar2) / (long)(int)_elempack;
        uVar25 = uVar12 & 0xffffffff;
        sVar13 = (uVar15 / uVar16) * (ulong)_elempack;
        _c = (int)uVar12;
        if (iVar11 == 3) {
          Mat::create(top_blob,iVar24,_h,_c,sVar13,_elempack,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,iVar24,_h,iVar23,_c,sVar13,_elempack,opt->blob_allocator);
        }
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        iVar23 = _h * iVar24 * iVar23;
        if (!bVar7 && !bVar8) {
          lVar14 = 0;
          iVar11 = 0;
          if (0 < iVar23) {
            iVar11 = iVar23;
          }
          if (_c < 1) {
            uVar25 = 0;
          }
          for (uVar16 = 0; uVar16 != uVar25; uVar16 = uVar16 + 1) {
            lVar17 = bottom_blob->cstep * bottom_blob->elemsize;
            pvVar5 = bottom_blob->data;
            lVar18 = top_blob->cstep * top_blob->elemsize * uVar16;
            pvVar6 = top_blob->data;
            for (lVar20 = 0; iVar11 != (int)lVar20; lVar20 = lVar20 + 1) {
              puVar1 = (undefined1 *)((long)pvVar5 + lVar20 + lVar17 * lVar14);
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18) = *puVar1;
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 1) = puVar1[lVar17];
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 2) = puVar1[lVar17 * 2];
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 3) = puVar1[lVar17 * 3];
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 4) = puVar1[lVar17 * 4];
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 5) = puVar1[lVar17 * 5];
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 6) = puVar1[lVar17 * 6];
              *(undefined1 *)((long)pvVar6 + lVar20 * 8 + lVar18 + 7) = puVar1[lVar17 * 7];
            }
            lVar14 = lVar14 + 8;
          }
        }
        if (!bVar9 || !bVar10) {
          return 0;
        }
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        uVar16 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar16 = 0;
        }
        lVar14 = 0;
        for (uVar15 = 0; uVar15 != uVar16; uVar15 = uVar15 + 1) {
          lVar17 = bottom_blob->cstep * bottom_blob->elemsize * uVar15;
          pvVar5 = bottom_blob->data;
          lVar18 = top_blob->cstep * top_blob->elemsize;
          pvVar6 = top_blob->data;
          for (lVar20 = 0; iVar23 != (int)lVar20; lVar20 = lVar20 + 1) {
            puVar1 = (undefined1 *)((long)pvVar6 + lVar20 + lVar18 * lVar14);
            *puVar1 = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17);
            puVar1[lVar18] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 1);
            puVar1[lVar18 * 2] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 2);
            puVar1[lVar18 * 3] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 3);
            puVar1[lVar18 * 4] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 4);
            puVar1[lVar18 * 5] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 5);
            puVar1[lVar18 * 6] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 6);
            puVar1[lVar18 * 7] = *(undefined1 *)((long)pvVar5 + lVar20 * 8 + lVar17 + 7);
          }
          lVar14 = lVar14 + 8;
        }
        return 0;
      }
    }
  }
  if (top_blob != bottom_blob) {
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar11 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar23 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar11;
    top_blob->h = iVar24;
    top_blob->d = iVar23;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  return 0;
}

Assistant:

int Packing_x86_fma::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;

    if (!pack1to8 && !pack8to1)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i * 8);
                const signed char* r1 = bottom_blob.row<const signed char>(i * 8 + 1);
                const signed char* r2 = bottom_blob.row<const signed char>(i * 8 + 2);
                const signed char* r3 = bottom_blob.row<const signed char>(i * 8 + 3);
                const signed char* r4 = bottom_blob.row<const signed char>(i * 8 + 4);
                const signed char* r5 = bottom_blob.row<const signed char>(i * 8 + 5);
                const signed char* r6 = bottom_blob.row<const signed char>(i * 8 + 6);
                const signed char* r7 = bottom_blob.row<const signed char>(i * 8 + 7);

                signed char* outptr = top_blob.row<signed char>(i);

                int j = 0;
                for (; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const signed char* r0 = bottom_blob.row<const signed char>(i);

                signed char* outptr0 = top_blob.row<signed char>(i * 8);
                signed char* outptr1 = top_blob.row<signed char>(i * 8 + 1);
                signed char* outptr2 = top_blob.row<signed char>(i * 8 + 2);
                signed char* outptr3 = top_blob.row<signed char>(i * 8 + 3);
                signed char* outptr4 = top_blob.row<signed char>(i * 8 + 4);
                signed char* outptr5 = top_blob.row<signed char>(i * 8 + 5);
                signed char* outptr6 = top_blob.row<signed char>(i * 8 + 6);
                signed char* outptr7 = top_blob.row<signed char>(i * 8 + 7);

                int j = 0;
                for (; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const signed char* r0 = bottom_blob.channel(q * 8);
                const signed char* r1 = bottom_blob.channel(q * 8 + 1);
                const signed char* r2 = bottom_blob.channel(q * 8 + 2);
                const signed char* r3 = bottom_blob.channel(q * 8 + 3);
                const signed char* r4 = bottom_blob.channel(q * 8 + 4);
                const signed char* r5 = bottom_blob.channel(q * 8 + 5);
                const signed char* r6 = bottom_blob.channel(q * 8 + 6);
                const signed char* r7 = bottom_blob.channel(q * 8 + 7);

                signed char* outptr = top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const signed char* r0 = bottom_blob.channel(q);

                signed char* outptr0 = top_blob.channel(q * 8);
                signed char* outptr1 = top_blob.channel(q * 8 + 1);
                signed char* outptr2 = top_blob.channel(q * 8 + 2);
                signed char* outptr3 = top_blob.channel(q * 8 + 3);
                signed char* outptr4 = top_blob.channel(q * 8 + 4);
                signed char* outptr5 = top_blob.channel(q * 8 + 5);
                signed char* outptr6 = top_blob.channel(q * 8 + 6);
                signed char* outptr7 = top_blob.channel(q * 8 + 7);

                int i = 0;
                for (; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }

        return 0;
    }

    return 0;
}